

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_2b9946::BuildFileImpl::parseToolsMapping(BuildFileImpl *this,MappingNode *map)

{
  BuildFileDelegate *pBVar1;
  uint uVar2;
  KeyValueNode *pKVar3;
  StringRef message;
  StringRef name_00;
  _Alloc_hider _Var4;
  size_type sVar5;
  char cVar6;
  Node *pNVar8;
  MappingNode *C;
  SequenceNode *C_00;
  Node *pNVar9;
  long *plVar10;
  size_t sVar11;
  ScalarNode *scalar;
  ScalarNode *scalar_00;
  ScalarNode *scalar_01;
  ScalarNode *scalar_02;
  ScalarNode *extraout_RDX;
  ScalarNode *scalar_03;
  ScalarNode *extraout_RDX_00;
  char *pcVar12;
  bool bVar13;
  StringRef message_00;
  StringRef message_01;
  StringRef message_02;
  StringRef message_03;
  string key;
  string value;
  iterator __begin2;
  iterator __begin5;
  iterator __begin3;
  string attribute;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  values;
  string name;
  string local_138;
  undefined1 local_118 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined1 local_d8 [32];
  Tool *local_b8;
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> local_b0;
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> local_a8;
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> local_a0;
  string local_98;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  Node *local_58;
  string local_50;
  int iVar7;
  
  local_b0.Base = (MappingNode *)llvm::yaml::begin<llvm::yaml::MappingNode>(map);
  if (local_b0.Base == (MappingNode *)0x0) {
    bVar13 = true;
  }
  else {
    do {
      pKVar3 = (local_b0.Base)->CurrentEntry;
      if (pKVar3 == (KeyValueNode *)0x0) {
LAB_0017ee19:
        pcVar12 = 
        "ValueT &llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode, llvm::yaml::KeyValueNode>::operator*() const [BaseT = llvm::yaml::MappingNode, ValueT = llvm::yaml::KeyValueNode]"
        ;
LAB_0017ee45:
        __assert_fail("Base && Base->CurrentEntry && \"Attempted to dereference end iterator!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/YAMLParser.h"
                      ,0x151,pcVar12);
      }
      pNVar8 = llvm::yaml::KeyValueNode::getKey(pKVar3);
      if (pNVar8->TypeID == 1) {
        pNVar8 = llvm::yaml::KeyValueNode::getValue(pKVar3);
        if (pNVar8->TypeID != 4) {
          pNVar8 = llvm::yaml::KeyValueNode::getValue(pKVar3);
          sVar11 = 0x21;
          pcVar12 = "invalid value type in \'tools\' map";
          goto LAB_0017ed96;
        }
        pNVar8 = llvm::yaml::KeyValueNode::getKey(pKVar3);
        (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                  (&local_50,pNVar8,scalar);
        C = (MappingNode *)llvm::yaml::KeyValueNode::getValue(pKVar3);
        name_00.Length = local_50._M_string_length;
        name_00.Data = local_50._M_dataplus._M_p;
        pNVar8 = llvm::yaml::KeyValueNode::getKey(pKVar3);
        local_b8 = getOrCreateTool(this,name_00,pNVar8);
        if (local_b8 == (Tool *)0x0) {
          iVar7 = 1;
        }
        else {
          local_a0.Base = (MappingNode *)llvm::yaml::begin<llvm::yaml::MappingNode>(C);
          while (local_a0.Base != (MappingNode *)0x0) {
            pKVar3 = (local_a0.Base)->CurrentEntry;
            if (pKVar3 == (KeyValueNode *)0x0) goto LAB_0017ee19;
            pNVar8 = llvm::yaml::KeyValueNode::getKey(pKVar3);
            C_00 = (SequenceNode *)llvm::yaml::KeyValueNode::getValue(pKVar3);
            if (pNVar8->TypeID == 1) {
              (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                        (&local_98,pNVar8,scalar_00);
              sVar5 = local_98._M_string_length;
              _Var4._M_p = local_98._M_dataplus._M_p;
              uVar2 = (C_00->super_Node).TypeID;
              if (uVar2 == 1) {
                local_108._8_8_ = (pNVar8->SourceRange).Start.Ptr;
                local_118._0_8_ = this->delegate;
                local_118._8_8_ = (this->mainFilename)._M_dataplus._M_p;
                local_108._M_allocated_capacity = (this->mainFilename)._M_string_length;
                local_f8._M_p._0_4_ = *(int *)&(pNVar8->SourceRange).End.Ptr - (int)local_108._8_8_;
                (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                          (&local_138,C_00,(ScalarNode *)local_108._M_allocated_capacity);
                iVar7 = (*local_b8->_vptr_Tool[2])
                                  (local_b8,local_118,_Var4._M_p,sVar5,local_138._M_dataplus._M_p,
                                   local_138._M_string_length);
                cVar6 = (char)iVar7;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_138._M_dataplus._M_p != &local_138.field_2) {
                  operator_delete(local_138._M_dataplus._M_p,
                                  local_138.field_2._M_allocated_capacity + 1);
                }
LAB_0017ecf1:
                iVar7 = 1;
                if (cVar6 != '\0') {
                  iVar7 = 0;
                }
              }
              else {
                if (uVar2 == 5) {
                  local_138._M_dataplus._M_p = (pointer)0x0;
                  local_138._M_string_length = 0;
                  local_138.field_2._M_allocated_capacity = 0;
                  local_d8._0_8_ = llvm::yaml::begin<llvm::yaml::SequenceNode>(C_00);
                  scalar_03 = extraout_RDX;
                  while (sVar5 = local_98._M_string_length, _Var4._M_p = local_98._M_dataplus._M_p,
                        (SequenceNode *)local_d8._0_8_ != (SequenceNode *)0x0) {
                    pNVar9 = *(Node **)(local_d8._0_8_ + 0x50);
                    if (pNVar9 == (Node *)0x0) {
                      pcVar12 = 
                      "ValueT &llvm::yaml::basic_collection_iterator<llvm::yaml::SequenceNode, llvm::yaml::Node>::operator*() const [BaseT = llvm::yaml::SequenceNode, ValueT = llvm::yaml::Node]"
                      ;
                      goto LAB_0017ee45;
                    }
                    if (pNVar9->TypeID == 1) {
                      (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                ((string *)local_118,pNVar9,scalar_03);
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&local_138,(string *)local_118);
                      if ((BuildFileDelegate *)local_118._0_8_ !=
                          (BuildFileDelegate *)(local_118 + 0x10)) {
                        operator_delete((void *)local_118._0_8_,
                                        (ulong)(local_108._M_allocated_capacity + 1));
                      }
                    }
                    else {
                      message_01.Length = 0x2a;
                      message_01.Data = "invalid value type for tool in \'tools\' map";
                      error(this,pNVar9,message_01);
                    }
                    llvm::yaml::
                    basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::
                    operator++((basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                *)local_d8);
                    scalar_03 = extraout_RDX_00;
                  }
                  local_108._8_8_ = (pNVar8->SourceRange).Start.Ptr;
                  local_118._0_8_ = this->delegate;
                  local_118._8_8_ = (this->mainFilename)._M_dataplus._M_p;
                  local_108._M_allocated_capacity = (this->mainFilename)._M_string_length;
                  local_f8._M_p._0_4_ =
                       *(int *)&(pNVar8->SourceRange).End.Ptr - (int)local_108._8_8_;
                  local_d8._0_8_ = (SequenceNode *)0x0;
                  local_d8._8_8_ = 0;
                  local_d8._16_8_ = 0;
                  std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>::
                  _M_range_initialize<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            ((vector<llvm::StringRef,std::allocator<llvm::StringRef>> *)local_d8,
                             local_138._M_dataplus._M_p,local_138._M_string_length);
                  iVar7 = (*local_b8->_vptr_Tool[3])
                                    (local_b8,local_118,_Var4._M_p,sVar5,local_d8._0_8_,
                                     (long)(local_d8._8_8_ - local_d8._0_8_) >> 4);
                  cVar6 = (char)iVar7;
                  if ((SequenceNode *)local_d8._0_8_ != (SequenceNode *)0x0) {
                    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ - local_d8._0_8_);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_138);
                  goto LAB_0017ecf1;
                }
                if (uVar2 == 4) {
                  local_78.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_78.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_78.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_a8.Base =
                       (MappingNode *)
                       llvm::yaml::begin<llvm::yaml::MappingNode>((MappingNode *)C_00);
                  local_58 = pNVar8;
                  _Var4._M_p = local_98._M_dataplus._M_p;
                  sVar5 = local_98._M_string_length;
                  while (local_98._M_dataplus._M_p = _Var4._M_p, local_98._M_string_length = sVar5,
                        local_a8.Base != (MappingNode *)0x0) {
                    pKVar3 = (local_a8.Base)->CurrentEntry;
                    if (pKVar3 == (KeyValueNode *)0x0) goto LAB_0017ee19;
                    pNVar9 = llvm::yaml::KeyValueNode::getKey(pKVar3);
                    if (pNVar9->TypeID == 1) {
                      pNVar9 = llvm::yaml::KeyValueNode::getValue(pKVar3);
                      if (pNVar9->TypeID != 1) {
                        pNVar9 = llvm::yaml::KeyValueNode::getKey(pKVar3);
                        pcVar12 = "invalid value type for \'";
                        goto LAB_0017e96b;
                      }
                      pNVar8 = llvm::yaml::KeyValueNode::getKey(pKVar3);
                      (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                (&local_138,pNVar8,scalar_01);
                      pNVar8 = llvm::yaml::KeyValueNode::getValue(pKVar3);
                      (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                ((string *)local_d8,pNVar8,scalar_02);
                      local_118._0_8_ = (BuildFileDelegate *)(local_118 + 0x10);
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)local_118,local_138._M_dataplus._M_p,
                                 local_138._M_dataplus._M_p + local_138._M_string_length);
                      local_f8._M_p = (pointer)&local_e8;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_f8,local_d8._0_8_,
                                 (pointer)(local_d8._0_8_ + local_d8._8_8_));
                      std::
                      vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                                ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                                  *)&local_78,
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_118);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_f8._M_p != &local_e8) {
                        operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
                      }
                      if ((BuildFileDelegate *)local_118._0_8_ !=
                          (BuildFileDelegate *)(local_118 + 0x10)) {
                        operator_delete((void *)local_118._0_8_,
                                        (ulong)(local_108._M_allocated_capacity + 1));
                      }
                      if ((SequenceNode *)local_d8._0_8_ != (SequenceNode *)(local_d8 + 0x10)) {
                        operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
                      }
                      pNVar8 = local_58;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_138._M_dataplus._M_p != &local_138.field_2) {
                        operator_delete(local_138._M_dataplus._M_p,
                                        local_138.field_2._M_allocated_capacity + 1);
                        pNVar8 = local_58;
                      }
                    }
                    else {
                      pNVar9 = llvm::yaml::KeyValueNode::getKey(pKVar3);
                      pcVar12 = "invalid key type for \'";
LAB_0017e96b:
                      std::operator+(&local_138,pcVar12,&local_98);
                      plVar10 = (long *)std::__cxx11::string::append((char *)&local_138);
                      pBVar1 = (BuildFileDelegate *)(plVar10 + 2);
                      if ((BuildFileDelegate *)*plVar10 == pBVar1) {
                        local_108._M_allocated_capacity = (size_type)pBVar1->_vptr_BuildFileDelegate
                        ;
                        local_108._8_8_ = plVar10[3];
                        local_118._0_8_ = (BuildFileDelegate *)(local_118 + 0x10);
                      }
                      else {
                        local_108._M_allocated_capacity = (size_type)pBVar1->_vptr_BuildFileDelegate
                        ;
                        local_118._0_8_ = (BuildFileDelegate *)*plVar10;
                      }
                      local_118._8_8_ = plVar10[1];
                      *plVar10 = (long)pBVar1;
                      plVar10[1] = 0;
                      *(undefined1 *)(plVar10 + 2) = 0;
                      message.Length = local_118._8_8_;
                      message.Data = (char *)local_118._0_8_;
                      error(this,pNVar9,message);
                      if ((BuildFileDelegate *)local_118._0_8_ !=
                          (BuildFileDelegate *)(local_118 + 0x10)) {
                        operator_delete((void *)local_118._0_8_,
                                        (ulong)(local_108._M_allocated_capacity + 1));
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_138._M_dataplus._M_p != &local_138.field_2) {
                        operator_delete(local_138._M_dataplus._M_p,
                                        local_138.field_2._M_allocated_capacity + 1);
                      }
                    }
                    llvm::yaml::
                    basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                    operator++(&local_a8);
                    _Var4._M_p = local_98._M_dataplus._M_p;
                    sVar5 = local_98._M_string_length;
                  }
                  local_108._8_8_ = (pNVar8->SourceRange).Start.Ptr;
                  local_118._0_8_ = this->delegate;
                  local_118._8_8_ = (this->mainFilename)._M_dataplus._M_p;
                  local_108._M_allocated_capacity = (this->mainFilename)._M_string_length;
                  local_f8._M_p._4_4_ = (undefined4)((ulong)local_f8._M_p >> 0x20);
                  local_f8._M_p._0_4_ =
                       *(int *)&(pNVar8->SourceRange).End.Ptr - (int)local_108._8_8_;
                  local_138._M_dataplus._M_p = (pointer)0x0;
                  local_138._M_string_length = 0;
                  local_138.field_2._M_allocated_capacity = 0;
                  std::
                  vector<std::pair<llvm::StringRef,llvm::StringRef>,std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
                  ::
                  _M_range_initialize<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>>
                            ((vector<std::pair<llvm::StringRef,llvm::StringRef>,std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
                              *)&local_138,
                             local_78.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             local_78.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
                  iVar7 = (*local_b8->_vptr_Tool[4])
                                    (local_b8,local_118,_Var4._M_p,sVar5,local_138._M_dataplus._M_p,
                                     (long)(local_138._M_string_length -
                                           (long)local_138._M_dataplus._M_p) >> 5);
                  cVar6 = (char)iVar7;
                  if (local_138._M_dataplus._M_p != (pointer)0x0) {
                    operator_delete(local_138._M_dataplus._M_p,
                                    local_138.field_2._M_allocated_capacity -
                                    (long)local_138._M_dataplus._M_p);
                  }
                  std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::~vector(&local_78);
                  goto LAB_0017ecf1;
                }
                message_02.Length = 0x2a;
                message_02.Data = "invalid value type for tool in \'tools\' map";
                error(this,(Node *)C_00,message_02);
                iVar7 = 5;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1
                               );
              }
            }
            else {
              message_00.Length = 0x28;
              message_00.Data = "invalid key type for tool in \'tools\' map";
              error(this,pNVar8,message_00);
              iVar7 = 5;
            }
            if ((iVar7 != 5) && (iVar7 != 0)) goto LAB_0017ed53;
            llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
            ::operator++(&local_a0);
          }
          iVar7 = 4;
LAB_0017ed53:
          if (iVar7 == 4) {
            iVar7 = 0;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        pNVar8 = llvm::yaml::KeyValueNode::getKey(pKVar3);
        sVar11 = 0x1f;
        pcVar12 = "invalid key type in \'tools\' map";
LAB_0017ed96:
        message_03.Length = sVar11;
        message_03.Data = pcVar12;
        error(this,pNVar8,message_03);
        iVar7 = 3;
      }
      if ((iVar7 != 3) && (iVar7 != 0)) goto LAB_0017edfd;
      llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
      operator++(&local_b0);
    } while (local_b0.Base != (MappingNode *)0x0);
    iVar7 = 2;
LAB_0017edfd:
    bVar13 = iVar7 == 2;
  }
  return bVar13;
}

Assistant:

bool parseToolsMapping(llvm::yaml::MappingNode* map) {
    for (auto& entry: *map) {
      // Every key must be scalar.
      if (entry.getKey()->getType() != llvm::yaml::Node::NK_Scalar) {
        error(entry.getKey(), "invalid key type in 'tools' map");
        continue;
      }
      // Every value must be a mapping.
      if (entry.getValue()->getType() != llvm::yaml::Node::NK_Mapping) {
        error(entry.getValue(), "invalid value type in 'tools' map");
        continue;
      }

      std::string name = stringFromScalarNode(
          static_cast<llvm::yaml::ScalarNode*>(entry.getKey()));
      llvm::yaml::MappingNode* attrs = static_cast<llvm::yaml::MappingNode*>(
          entry.getValue());

      // Get the tool.
      auto tool = getOrCreateTool(name, entry.getKey());
      if (!tool) {
        return false;
      }

      // Configure all of the tool attributes.
      for (auto& valueEntry: *attrs) {
        auto key = valueEntry.getKey();
        auto value = valueEntry.getValue();
        
        // All keys must be scalar.
        if (key->getType() != llvm::yaml::Node::NK_Scalar) {
          error(key, "invalid key type for tool in 'tools' map");
          continue;
        }


        auto attribute = stringFromScalarNode(
            static_cast<llvm::yaml::ScalarNode*>(key));

        if (value->getType() == llvm::yaml::Node::NK_Mapping) {
          std::vector<std::pair<std::string, std::string>> values;
          for (auto& entry: *static_cast<llvm::yaml::MappingNode*>(value)) {
            // Every key must be scalar.
            if (entry.getKey()->getType() != llvm::yaml::Node::NK_Scalar) {
              error(entry.getKey(), ("invalid key type for '" + attribute +
                                     "' in 'tools' map"));
              continue;
            }
            // Every value must be scalar.
            if (entry.getValue()->getType() != llvm::yaml::Node::NK_Scalar) {
              error(entry.getKey(), ("invalid value type for '" + attribute +
                                     "' in 'tools' map"));
              continue;
            }

            std::string key = stringFromScalarNode(
                static_cast<llvm::yaml::ScalarNode*>(entry.getKey()));
            std::string value = stringFromScalarNode(
                static_cast<llvm::yaml::ScalarNode*>(entry.getValue()));
            values.push_back(std::make_pair(key, value));
          }

          if (!tool->configureAttribute(
                  getContext(key), attribute,
                  std::vector<std::pair<StringRef, StringRef>>(
                      values.begin(), values.end()))) {
            return false;
          }
        } else if (value->getType() == llvm::yaml::Node::NK_Sequence) {
          std::vector<std::string> values;
          for (auto& node: *static_cast<llvm::yaml::SequenceNode*>(value)) {
            if (node.getType() != llvm::yaml::Node::NK_Scalar) {
              error(&node, "invalid value type for tool in 'tools' map");
              continue;
            }
            values.push_back(
                stringFromScalarNode(
                    static_cast<llvm::yaml::ScalarNode*>(&node)));
          }

          if (!tool->configureAttribute(
                  getContext(key), attribute,
                  std::vector<StringRef>(values.begin(), values.end()))) {
            return false;
          }
        } else {
          if (value->getType() != llvm::yaml::Node::NK_Scalar) {
            error(value, "invalid value type for tool in 'tools' map");
            continue;
          }

          if (!tool->configureAttribute(
                  getContext(key), attribute,
                  stringFromScalarNode(
                      static_cast<llvm::yaml::ScalarNode*>(value)))) {
            return false;
          }
        }
      }
    }

    return true;
  }